

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectOneCallInScopeButActualCallInGlobal_Test::
~TEST_MockCallTest_expectOneCallInScopeButActualCallInGlobal_Test
          (TEST_MockCallTest_expectOneCallInScopeButActualCallInGlobal_Test *this)

{
  TEST_MockCallTest_expectOneCallInScopeButActualCallInGlobal_Test *this_local;
  
  ~TEST_MockCallTest_expectOneCallInScopeButActualCallInGlobal_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockCallTest, expectOneCallInScopeButActualCallInGlobal)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest emptyExpectations;
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "foo", emptyExpectations);

    mock("scope").expectOneCall("foo");
    mock().actualCall("foo");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
    mock().clear();
}